

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O2

void __thiscall Function::setYInput(Function *this,double d)

{
  if ((this->dNextYInput != d) || (NAN(this->dNextYInput) || NAN(d))) {
    this->dNextYInput = d;
    if (this->eType == INPUT_Y) {
      this->dValue = d;
    }
    if (this->xLeft != (Function *)0x0) {
      setYInput(this->xLeft,d);
    }
    if (this->xRight != (Function *)0x0) {
      setYInput(this->xRight,d);
    }
    if (this->xPlus != (Function *)0x0) {
      setYInput(this->xPlus,d);
    }
    this->bValueValid = false;
  }
  return;
}

Assistant:

void Function::setYInput(double d)
{
	if (dNextYInput != d) {
		dNextYInput = d;
		if (eType==INPUT_Y) {
			dValue = d;
		}
		if (xLeft) xLeft->setYInput(d);
		if (xRight) xRight->setYInput(d);
		if (xPlus) xPlus->setYInput(d);
		bValueValid = false;
	}
}